

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData256 *
cfd::core::CryptoUtil::HmacSha256(ByteData256 *__return_storage_ptr__,ByteData *key,ByteData *data)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,key);
  HmacSha256(__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 CryptoUtil::HmacSha256(const ByteData &key, const ByteData &data) {
  return HmacSha256(key.GetBytes(), data);
}